

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

bool __thiscall
QGles2SwapChainTimestamps::tryQueryTimestamps
          (QGles2SwapChainTimestamps *this,int pairIndex,QRhiGles2 *rhiD,double *elapsedSec)

{
  GLuint GVar1;
  uint uVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 auVar5 [16];
  GLuint ready;
  int local_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->active[pairIndex] == true) {
    GVar1 = this->query[pairIndex * 2];
    uVar2 = this->query[pairIndex * 2 + 1];
    local_4c = 0;
    (*(rhiD->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.functions[0xd])
              ((ulong)uVar2,0x8867,&local_4c);
    if (local_4c != 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      (*rhiD->glGetQueryObjectui64v)(GVar1,0x8866,(quint64 *)&local_48);
      (*rhiD->glGetQueryObjectui64v)(uVar2,0x8866,(quint64 *)&puStack_40);
      bVar4 = local_48 <= puStack_40;
      lVar3 = (long)puStack_40 - (long)local_48;
      if (bVar4) {
        auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar5._0_8_ = lVar3;
        auVar5._12_4_ = 0x45300000;
        *elapsedSec = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000000.0
        ;
      }
      this->active[pairIndex] = false;
      goto LAB_005689a6;
    }
  }
  bVar4 = false;
LAB_005689a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2SwapChainTimestamps::tryQueryTimestamps(int pairIndex, QRhiGles2 *rhiD, double *elapsedSec)
{
    if (!active[pairIndex])
        return false;

    GLuint tsStart = query[pairIndex * 2];
    GLuint tsEnd = query[pairIndex * 2 + 1];

    GLuint ready = GL_FALSE;
    rhiD->f->glGetQueryObjectuiv(tsEnd, GL_QUERY_RESULT_AVAILABLE, &ready);

    if (!ready)
        return false;

    bool result = false;
    quint64 timestamps[2];
    rhiD->glGetQueryObjectui64v(tsStart, GL_QUERY_RESULT, &timestamps[0]);
    rhiD->glGetQueryObjectui64v(tsEnd, GL_QUERY_RESULT, &timestamps[1]);

    if (timestamps[1] >= timestamps[0]) {
        const quint64 nanoseconds = timestamps[1] - timestamps[0];
        *elapsedSec = nanoseconds / 1000000000.0;
        result = true;
    }

    active[pairIndex] = false;
    return result;
}